

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O2

void mh_assoc_del(mh_assoc_t *h,mh_int_t x,void *arg)

{
  mh_int_t *pmVar1;
  sbyte sVar2;
  uint uVar3;
  
  if (h->n_buckets != x) {
    pmVar1 = h->b;
    uVar3 = x >> 4;
    sVar2 = (sbyte)(x & 0xf);
    if ((pmVar1[uVar3] >> (x & 0xf) & 1) != 0) {
      pmVar1[uVar3] = pmVar1[uVar3] & ~(1 << sVar2);
      h->size = h->size - 1;
      if (((pmVar1[uVar3] >> sVar2) >> 0x10 & 1) == 0) {
        h->n_dirty = h->n_dirty - 1;
      }
      if (h->resize_position != 0) {
        mh_assoc_del_resize(h,x,(void *)0x0);
        return;
      }
    }
  }
  return;
}

Assistant:

static inline void
_mh(del)(struct _mh(t) *h, mh_int_t x,
	 mh_arg_t arg)
{
	if (x != h->n_buckets && mh_exist(h, x)) {
		mh_setfree(h, x);
		h->size--;
		if (!mh_dirty(h, x))
			h->n_dirty--;
#if MH_INCREMENTAL_RESIZE
		if (mh_unlikely(h->resize_position))
			_mh(del_resize)(h, x, arg);
#endif
	}
}